

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprSrcCount(Walker *pWalker,Expr *pExpr)

{
  int iVar1;
  SrcCount *pSVar2;
  SrcList *pSVar3;
  ulong uVar4;
  int *piVar5;
  ulong uVar6;
  bool bVar7;
  
  if ((pExpr->op | 2) == 0x9a) {
    pSVar2 = (pWalker->u).pSrcCount;
    pSVar3 = pSVar2->pSrc;
    uVar4 = (ulong)pSVar3->nSrc;
    bVar7 = 0 < (long)uVar4;
    if (0 < (long)uVar4) {
      if (pExpr->iTable != pSVar3->a[0].iCursor) {
        uVar6 = 0;
        piVar5 = &pSVar3[1].a[0].regReturn;
        do {
          if (uVar4 - 1 == uVar6) goto LAB_0018770d;
          uVar6 = uVar6 + 1;
          iVar1 = *piVar5;
          piVar5 = piVar5 + 0x1a;
        } while (pExpr->iTable != iVar1);
        bVar7 = uVar6 < uVar4;
      }
      if (bVar7) {
        pSVar2->nThis = pSVar2->nThis + 1;
        return 0;
      }
    }
LAB_0018770d:
    pSVar2->nOther = pSVar2->nOther + 1;
  }
  return 0;
}

Assistant:

static int exprSrcCount(Walker *pWalker, Expr *pExpr){
  /* The NEVER() on the second term is because sqlite3FunctionUsesThisSrc()
  ** is always called before sqlite3ExprAnalyzeAggregates() and so the
  ** TK_COLUMNs have not yet been converted into TK_AGG_COLUMN.  If
  ** sqlite3FunctionUsesThisSrc() is used differently in the future, the
  ** NEVER() will need to be removed. */
  if( pExpr->op==TK_COLUMN || NEVER(pExpr->op==TK_AGG_COLUMN) ){
    int i;
    struct SrcCount *p = pWalker->u.pSrcCount;
    SrcList *pSrc = p->pSrc;
    for(i=0; i<pSrc->nSrc; i++){
      if( pExpr->iTable==pSrc->a[i].iCursor ) break;
    }
    if( i<pSrc->nSrc ){
      p->nThis++;
    }else{
      p->nOther++;
    }
  }
  return WRC_Continue;
}